

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

bool __thiscall cfd::core::ByteData256::operator==(ByteData256 *this,ByteData256 *object)

{
  bool bVar1;
  ByteData256 *object_local;
  ByteData256 *this_local;
  
  bVar1 = ::std::operator==(&this->data_,&object->data_);
  return bVar1;
}

Assistant:

bool ByteData256::operator==(const ByteData256& object) const {
  return (data_ == object.data_);
}